

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_ObjSuppSize_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  
  local_28 = 0;
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsPi(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pObj);
      if ((iVar1 == 0) && (iVar1 = Abc_ObjIsBox(pObj), iVar1 == 0)) {
        __assert_fail("Abc_ObjIsNode(pObj) || Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                      ,0x438,"int Abc_ObjSuppSize_rec(Abc_Obj_t *)");
      }
      for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
        pObj_00 = Abc_ObjFanin(pObj,local_24);
        iVar1 = Abc_ObjSuppSize_rec(pObj_00);
        local_28 = iVar1 + local_28;
      }
      pObj_local._4_4_ = local_28;
    }
    else {
      pObj_local._4_4_ = 1;
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_ObjSuppSize_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Counter = 0;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Abc_ObjIsPi(pObj) )
        return 1;
    assert( Abc_ObjIsNode(pObj) || Abc_ObjIsBox(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Counter += Abc_ObjSuppSize_rec( pFanin );
    return Counter;
}